

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

int Saig_ManBmcCountRefed(Aig_Man_t *p,Vec_Ptr_t *vSuper)

{
  void *pvVar1;
  int i;
  int iVar2;
  
  i = 0;
  iVar2 = 0;
  while( true ) {
    if (vSuper->nSize <= i) {
      return iVar2;
    }
    pvVar1 = Vec_PtrEntry(vSuper,i);
    if (((ulong)pvVar1 & 1) != 0) break;
    iVar2 = (iVar2 + 1) - (uint)((*(uint *)((long)pvVar1 + 0x18) & 0xffffff80) == 0);
    i = i + 1;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                ,0x21e,"int Saig_ManBmcCountRefed(Aig_Man_t *, Vec_Ptr_t *)");
}

Assistant:

int Saig_ManBmcCountRefed( Aig_Man_t * p, Vec_Ptr_t * vSuper )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pObj, i )
    {
        assert( !Aig_IsComplement(pObj) );
        Counter += (Aig_ObjRefs(pObj) > 1);
    }
    return Counter;
}